

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

size_t tchecker::ta::shared_hash_value(state_t *s)

{
  state_t local_20;
  size_t h;
  state_t *s_local;
  
  h = (size_t)s;
  local_20._intval._t =
       (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)
       syncprod::shared_hash_value(&s->super_state_t);
  state_t::intval_ptr(&local_20);
  boost::
  hash_combine<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>const>>
            ((size_t *)&local_20._intval,
             (intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
              *)&local_20);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
              *)&local_20);
  return (size_t)local_20._intval._t;
}

Assistant:

std::size_t shared_hash_value(tchecker::ta::state_t const & s)
{
  std::size_t h = tchecker::syncprod::shared_hash_value(s);
  boost::hash_combine(h, s.intval_ptr());
  return h;
}